

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglnativeinterfacehandler.cpp
# Opt level: O3

NativeResourceForIntegrationFunction __thiscall
QXcbEglNativeInterfaceHandler::nativeResourceFunctionForIntegration
          (QXcbEglNativeInterfaceHandler *this,QByteArray *resource)

{
  int iVar1;
  code *pcVar2;
  
  iVar1 = resourceType(resource);
  pcVar2 = (NativeResourceForIntegrationFunction)0x0;
  if (iVar1 == 0) {
    pcVar2 = eglDisplay;
  }
  return pcVar2;
}

Assistant:

QPlatformNativeInterface::NativeResourceForIntegrationFunction QXcbEglNativeInterfaceHandler::nativeResourceFunctionForIntegration(const QByteArray &resource) const{
    switch (resourceType(resource)) {
    case EglDisplay:
        return eglDisplay;
    default:
        break;
    }
    return nullptr;
}